

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O0

_Bool pmp_hart_has_privs_riscv64
                (CPURISCVState_conflict2 *env,target_ulong addr,target_ulong size,pmp_priv_t privs,
                target_ulong mode)

{
  uint8_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  pmp_priv_t local_5c;
  uint8_t a_field;
  pmp_priv_t allowed_privs;
  target_ulong e;
  target_ulong s;
  uint local_40;
  int pmp_size;
  int ret;
  int i;
  target_ulong mode_local;
  pmp_priv_t privs_local;
  target_ulong size_local;
  target_ulong addr_local;
  CPURISCVState_conflict2 *env_local;
  
  local_40 = 0xffffffff;
  uVar2 = pmp_get_num_rules(env);
  if (uVar2 == 0) {
    env_local._7_1_ = true;
  }
  else {
    if (size == 0) {
      s._4_4_ = -((uint)addr | 0xfffff000);
    }
    else {
      s._4_4_ = (int)size;
    }
    for (pmp_size = 0; pmp_size < 0x10; pmp_size = pmp_size + 1) {
      iVar3 = pmp_is_in_range(env,pmp_size,addr);
      iVar4 = pmp_is_in_range(env,pmp_size,(addr + (long)s._4_4_) - 1);
      if ((long)iVar3 + (long)iVar4 == 1) {
        local_40 = 0;
        break;
      }
      uVar1 = pmp_get_a_field((env->pmp_state).pmp[pmp_size].cfg_reg);
      if (((long)iVar3 + (long)iVar4 == 2) && (uVar1 != '\0')) {
        local_5c = PMP_EXEC|PMP_WRITE|PMP_READ;
        if ((mode != 3) || (iVar3 = pmp_is_locked(env,pmp_size), iVar3 != 0)) {
          local_5c = (env->pmp_state).pmp[pmp_size].cfg_reg & (PMP_EXEC|PMP_WRITE|PMP_READ);
        }
        if ((privs & local_5c) == privs) {
          local_40 = 1;
        }
        else {
          local_40 = 0;
        }
        break;
      }
    }
    if (local_40 == 0xffffffff) {
      local_40 = (uint)(mode == 3);
    }
    env_local._7_1_ = local_40 == 1;
  }
  return env_local._7_1_;
}

Assistant:

bool pmp_hart_has_privs(CPURISCVState *env, target_ulong addr,
    target_ulong size, pmp_priv_t privs, target_ulong mode)
{
    int i = 0;
    int ret = -1;
    int pmp_size = 0;
    target_ulong s = 0;
    target_ulong e = 0;
    pmp_priv_t allowed_privs = 0;

    /* Short cut if no rules */
    if (0 == pmp_get_num_rules(env)) {
        return true;
    }

    /*
     * if size is unknown (0), assume that all bytes
     * from addr to the end of the page will be accessed.
     */
    if (size == 0) {
#ifdef _MSC_VER
        pmp_size = 0 - (addr | TARGET_PAGE_MASK);
#else
        pmp_size = -(addr | TARGET_PAGE_MASK);
#endif
    } else {
        pmp_size = size;
    }

    /* 1.10 draft priv spec states there is an implicit order
         from low to high */
    for (i = 0; i < MAX_RISCV_PMPS; i++) {
        s = pmp_is_in_range(env, i, addr);
        e = pmp_is_in_range(env, i, addr + pmp_size - 1);

        /* partially inside */
        if ((s + e) == 1) {
            qemu_log_mask(LOG_GUEST_ERROR,
                          "pmp violation - access is partially inside\n");
            ret = 0;
            break;
        }

        /* fully inside */
        const uint8_t a_field =
            pmp_get_a_field(env->pmp_state.pmp[i].cfg_reg);

        /*
         * If the PMP entry is not off and the address is in range, do the priv
         * check
         */
        if (((s + e) == 2) && (PMP_AMATCH_OFF != a_field)) {
            allowed_privs = PMP_READ | PMP_WRITE | PMP_EXEC;
            if ((mode != PRV_M) || pmp_is_locked(env, i)) {
                allowed_privs &= env->pmp_state.pmp[i].cfg_reg;
            }

            if ((privs & allowed_privs) == privs) {
                ret = 1;
                break;
            } else {
                ret = 0;
                break;
            }
        }
    }

    /* No rule matched */
    if (ret == -1) {
        if (mode == PRV_M) {
            ret = 1; /* Privileged spec v1.10 states if no PMP entry matches an
                      * M-Mode access, the access succeeds */
        } else {
            ret = 0; /* Other modes are not allowed to succeed if they don't
                      * match a rule, but there are rules.  We've checked for
                      * no rule earlier in this function. */
        }
    }

    return ret == 1 ? true : false;
}